

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.h
# Opt level: O0

void __thiscall
intgemm::AlignedVector<float>::AlignedVector
          (AlignedVector<float> *this,size_t size,size_t alignment)

{
  int iVar1;
  bad_alloc *this_00;
  size_t in_RDX;
  void *in_RSI;
  void **in_RDI;
  
  in_RDI[1] = in_RSI;
  iVar1 = posix_memalign(in_RDI,in_RDX,(long)in_RSI << 2);
  if (iVar1 != 0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return;
}

Assistant:

explicit AlignedVector(std::size_t size, std::size_t alignment = 64 /* CPU cares about this */)
      : size_(size) {
#ifdef _MSC_VER
      mem_ = static_cast<T*>(_aligned_malloc(size * sizeof(T), alignment));
      if (!mem_) {
#  if (defined(_MSC_VER) && !defined(__clang__)) ? (_HAS_EXCEPTIONS) : (__EXCEPTIONS)
        throw std::bad_alloc();
#  else
        std::abort();
#  endif
      }
#else
      if (posix_memalign(reinterpret_cast<void **>(&mem_), alignment, size * sizeof(T))) {
#  if (defined(_MSC_VER) && !defined(__clang__)) ? (_HAS_EXCEPTIONS) : (__EXCEPTIONS)
        throw std::bad_alloc();
#  else
        std::abort();
#  endif
      }
#endif
    }